

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

Error __thiscall
asmjit::StringBuilder::_opVFormat(StringBuilder *this,uint32_t op,char *fmt,__va_list_tag *ap)

{
  size_t len;
  char *__dest;
  char buf [1024];
  char acStack_418 [1023];
  undefined1 local_19;
  
  vsnprintf(acStack_418,0x400,fmt,ap);
  local_19 = 0;
  len = strlen(acStack_418);
  __dest = prepare(this,op,len);
  if (__dest != (char *)0x0) {
    memcpy(__dest,acStack_418,len);
  }
  return (uint)(__dest == (char *)0x0);
}

Assistant:

Error StringBuilder::_opVFormat(uint32_t op, const char* fmt, va_list ap) noexcept {
  char buf[1024];

  vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
  buf[ASMJIT_ARRAY_SIZE(buf) - 1] = '\0';

  return _opString(op, buf);
}